

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_device_uninit__null(ma_device *pDevice)

{
  if (pDevice != (ma_device *)0x0) {
    ma_device_do_operation__null(pDevice,3);
    ma_event_uninit(&(pDevice->field_23).null_device.operationCompletionEvent);
    ma_event_uninit(&(pDevice->field_23).null_device.operationEvent);
    return;
  }
  __assert_fail("pDevice != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x24f6,"void ma_device_uninit__null(ma_device *)");
}

Assistant:

static void ma_device_uninit__null(ma_device* pDevice)
{
    MA_ASSERT(pDevice != NULL);

    /* Keep it clean and wait for the device thread to finish before returning. */
    ma_device_do_operation__null(pDevice, MA_DEVICE_OP_KILL__NULL);

    /* At this point the loop in the device thread is as good as terminated so we can uninitialize our events. */
    ma_event_uninit(&pDevice->null_device.operationCompletionEvent);
    ma_event_uninit(&pDevice->null_device.operationEvent);
}